

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O3

void __thiscall gdsSTR::~gdsSTR(gdsSTR *this)

{
  pointer piVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::vector<gdsBOX,_std::allocator<gdsBOX>_>::~vector(&this->BOX);
  std::vector<gdsNODE,_std::allocator<gdsNODE>_>::~vector(&this->NODE);
  std::vector<gdsTEXT,_std::allocator<gdsTEXT>_>::~vector(&this->TEXT);
  std::vector<gdsAREF,_std::allocator<gdsAREF>_>::~vector(&this->AREF);
  std::vector<gdsSREF,_std::allocator<gdsSREF>_>::~vector(&this->SREF);
  std::vector<gdsPATH,_std::allocator<gdsPATH>_>::~vector(&this->PATH);
  std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::~vector(&this->BOUNDARY);
  piVar1 = (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->last_modified).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

gdsSTR(){}